

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

bool __thiscall
r_comp::Compiler::read_set
          (Compiler *this,Ptr *node,bool enforce,Class *p,uint16_t write_index,
          uint16_t *extent_index,bool write)

{
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  Class *p_00;
  bool bVar2;
  uint16_t *puVar3;
  undefined7 in_register_00000011;
  allocator local_125;
  undefined4 local_124;
  Class *local_120;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_118;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_108;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_f8;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_d8;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_c8;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_b8;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_a8;
  string local_98;
  Class local_78;
  
  local_124 = (undefined4)CONCAT71(in_register_00000011,enforce);
  local_120 = p;
  std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_a8,&node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
  puVar3 = extent_index;
  bVar2 = read_nil_set(this,(Ptr *)&local_a8,write_index,extent_index,write);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
  if (!bVar2) {
    std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_118,&node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
              );
    Class::Class(&local_78,SET);
    bVar2 = read_variable(this,(Ptr *)&local_118,write_index,puVar3,write,&local_78);
    Class::~Class(&local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_118._M_refcount);
    if (!bVar2) {
      std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_b8,
                 &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
      puVar3 = extent_index;
      bVar2 = read_reference(this,(Ptr *)&local_b8,write_index,extent_index,write,SET);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
      if (!bVar2) {
        std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_c8,
                   &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
        bVar2 = read_wildcard(this,(Ptr *)&local_c8,write_index,puVar3,write);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
        if (!bVar2) {
          std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_d8,
                     &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
          bVar2 = read_tail_wildcard(this,(Ptr *)&local_d8,write_index,puVar3,write);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8._M_refcount);
          p_00 = local_120;
          if (bVar2) {
            return true;
          }
          if (local_120 == (Class *)0x0) {
            std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_f8,
                       &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
            bVar2 = set(this,(Ptr *)&local_f8,write_index,extent_index,write);
            p_Var1 = &local_f8;
          }
          else {
            std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_e8,
                       &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
            bVar2 = set(this,(Ptr *)&local_e8,p_00,write_index,extent_index,write);
            p_Var1 = &local_e8;
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var1->_M_refcount);
          if ((char)local_124 == '\x01' && bVar2 == false) {
            std::__cxx11::string::string((string *)&local_98," error: expected a set",&local_125);
            std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_108,
                       &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
            set_error(this,&local_98,(Ptr *)&local_108);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108._M_refcount)
            ;
            std::__cxx11::string::~string((string *)&local_98);
            return false;
          }
          return bVar2;
        }
      }
    }
  }
  return true;
}

Assistant:

bool Compiler::read_set(RepliStruct::Ptr node, bool enforce, const Class *p, uint16_t write_index, uint16_t &extent_index, bool write)
{
    if (read_nil_set(node, write_index, extent_index, write)) {
        return true;
    } else if (read_variable(node, write_index, extent_index, write, Class(SET))) {
        return true;
    } else if (read_reference(node, write_index, extent_index, write, SET)) {
        return true;
    } else if (read_wildcard(node, write_index, extent_index, write)) {
        return true;
    } else if (read_tail_wildcard(node, write_index, extent_index, write)) {
        return true;
    }

    if (p) {
        if (set(node, *p, write_index, extent_index, write)) {
            return true;
        }
    } else if (set(node, write_index, extent_index, write)) {
        return true;
    }

    if (enforce) {
        set_error(" error: expected a set", node);
        return false;
    }

    return false;
}